

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# managed_buffer.cpp
# Opt level: O3

void __thiscall polyscope::render::ManagedBuffer<int>::updateIndexedViews(ManagedBuffer<int> *this)

{
  int iVar1;
  pointer ptVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar3;
  ManagedBuffer<unsigned_int> *this_01;
  _Atomic_word _Var4;
  pointer ptVar5;
  bool bVar6;
  vector<int,_std::allocator<int>_> expandData;
  vector<int,_std::allocator<int>_> local_48;
  
  checkDeviceBufferTypeIs(this,Attribute);
  removeDeletedIndexedViews(this);
  ptVar5 = (this->existingIndexedViews).
           super__Vector_base<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>,_std::allocator<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ptVar2 = (this->existingIndexedViews).
           super__Vector_base<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>,_std::allocator<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ptVar5 != ptVar2) {
    do {
      this_00 = (ptVar5->
                super__Tuple_impl<0UL,_polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>
                ).super__Tuple_impl<1UL,_std::weak_ptr<polyscope::render::AttributeBuffer>_>.
                super__Head_base<1UL,_std::weak_ptr<polyscope::render::AttributeBuffer>,_false>.
                _M_head_impl.
                super___weak_ptr<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        _Var4 = this_00->_M_use_count;
        do {
          if (_Var4 == 0) goto LAB_0022129b;
          LOCK();
          iVar1 = this_00->_M_use_count;
          bVar6 = _Var4 == iVar1;
          if (bVar6) {
            this_00->_M_use_count = _Var4 + 1;
            iVar1 = _Var4;
          }
          _Var4 = iVar1;
          UNLOCK();
        } while (!bVar6);
        peVar3 = (ptVar5->
                 super__Tuple_impl<0UL,_polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>
                 ).super__Tuple_impl<1UL,_std::weak_ptr<polyscope::render::AttributeBuffer>_>.
                 super__Head_base<1UL,_std::weak_ptr<polyscope::render::AttributeBuffer>,_false>.
                 _M_head_impl.
                 super___weak_ptr<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        if (peVar3 != (element_type *)0x0 && this_00->_M_use_count != 0) {
          this_01 = (ptVar5->
                    super__Tuple_impl<0UL,_polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>
                    ).super__Head_base<0UL,_polyscope::render::ManagedBuffer<unsigned_int>_*,_false>
                    ._M_head_impl;
          ManagedBuffer<unsigned_int>::ensureHostBufferPopulated(this_01);
          gather<int>(&local_48,this->data,this_01->data);
          (**(code **)((long)peVar3->_vptr_AttributeBuffer + 0x38))(peVar3,&local_48);
          if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start != (pointer)0x0) {
            operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
        }
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
LAB_0022129b:
      ptVar5 = ptVar5 + 1;
    } while (ptVar5 != ptVar2);
  }
  requestRedraw();
  return;
}

Assistant:

void ManagedBuffer<T>::updateIndexedViews() {
  checkDeviceBufferTypeIs(DeviceBufferType::Attribute);

  removeDeletedIndexedViews(); // periodic filtering

  for (std::tuple<render::ManagedBuffer<uint32_t>*, std::weak_ptr<render::AttributeBuffer>>& existingViewTup :
       existingIndexedViews) {

    std::shared_ptr<render::AttributeBuffer> viewBufferPtr = std::get<1>(existingViewTup).lock();
    if (!viewBufferPtr) continue; // skip if it has been deleted (will be removed eventually)

    // note: index buffer must still be alive here. we can't check it, you will just get memory errors
    // if it has been deleted
    render::ManagedBuffer<uint32_t>& indices = *std::get<0>(existingViewTup);
    render::AttributeBuffer& viewBuffer = *viewBufferPtr;

    // apply the indexing and set the data
    indices.ensureHostBufferPopulated();
    std::vector<T> expandData = gather(data, indices.data);
    viewBuffer.setData(expandData);

    // TODO fornow, only CPU-side updating is supported. Add direct GPU-side support using the bufferIndexCopyProgram
    // below.
  }

  requestRedraw();
}